

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O2

nng_err nni_http_chunks_init(nni_http_chunks **clp,size_t maxsz)

{
  nni_http_chunks *list;
  nng_err nVar1;
  
  list = (nni_http_chunks *)nni_zalloc(0x38);
  if (list == (nni_http_chunks *)0x0) {
    nVar1 = NNG_ENOMEM;
  }
  else {
    nVar1 = NNG_OK;
    nni_list_init_offset((nni_list *)list,0);
    list->cl_maxsz = maxsz;
    *clp = list;
  }
  return nVar1;
}

Assistant:

nng_err
nni_http_chunks_init(nni_http_chunks **clp, size_t maxsz)
{
	nni_http_chunks *cl;

	if ((cl = NNI_ALLOC_STRUCT(cl)) == NULL) {
		return (NNG_ENOMEM);
	}
	NNI_LIST_INIT(&cl->cl_chunks, nni_http_chunk, c_node);
	cl->cl_maxsz = maxsz;
	*clp         = cl;
	return (NNG_OK);
}